

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# image_match.cpp
# Opt level: O0

vector<std::filesystem::__cxx11::path,_std::allocator<std::filesystem::__cxx11::path>_> *
find_database_file_abi_cxx11_(void)

{
  source_loc loc;
  source_loc loc_00;
  bool bVar1;
  logger *plVar2;
  path *ppVar3;
  vector<std::filesystem::__cxx11::path,_std::allocator<std::filesystem::__cxx11::path>_> *in_RDI;
  string local_168;
  string_view_t local_148;
  source_loc local_138;
  path local_120;
  path local_f8;
  path local_d0;
  directory_entry *local_a8;
  directory_entry *dir_entry;
  directory_iterator local_98;
  undefined1 local_88 [8];
  directory_iterator __end1;
  undefined1 local_68 [8];
  directory_iterator __begin1;
  directory_iterator local_48;
  directory_iterator *local_38;
  directory_iterator *__range1;
  source_loc local_28;
  vector<std::filesystem::__cxx11::path,_std::allocator<std::filesystem::__cxx11::path>_> *ans;
  
  plVar2 = spdlog::default_logger_raw();
  spdlog::source_loc::source_loc
            (&local_28,
             "/workspace/llm4binary/github/license_all_cmakelists_25/dkubek[P]NPRG041-image_match/apps/image_match.cpp"
             ,0xf4,"find_database_file");
  loc.line = local_28.line;
  loc._12_4_ = local_28._12_4_;
  loc.filename = local_28.filename;
  loc.funcname = local_28.funcname;
  spdlog::logger::log<char[29],_0>(plVar2,loc,debug,(char (*) [29])"Looking for database file...");
  __range1._7_1_ = 0;
  CLI::std::vector<std::filesystem::__cxx11::path,_std::allocator<std::filesystem::__cxx11::path>_>
  ::vector(in_RDI);
  CLI::std::filesystem::__cxx11::directory_iterator::directory_iterator(&local_48,&app.dataset);
  local_38 = &local_48;
  CLI::std::filesystem::__cxx11::directory_iterator::directory_iterator
            ((directory_iterator *)&__end1._M_dir._M_refcount,local_38);
  CLI::std::filesystem::__cxx11::begin
            ((__cxx11 *)local_68,(directory_iterator *)&__end1._M_dir._M_refcount);
  CLI::std::filesystem::__cxx11::directory_iterator::~directory_iterator
            ((directory_iterator *)&__end1._M_dir._M_refcount);
  CLI::std::filesystem::__cxx11::directory_iterator::directory_iterator(&local_98,local_38);
  CLI::std::filesystem::__cxx11::end((directory_iterator *)local_88);
  CLI::std::filesystem::__cxx11::directory_iterator::~directory_iterator(&local_98);
  do {
    bVar1 = CLI::std::filesystem::__cxx11::operator!=
                      ((directory_iterator *)local_68,(directory_iterator *)local_88);
    if (!bVar1) {
      dir_entry._4_4_ = 2;
LAB_001121e2:
      CLI::std::filesystem::__cxx11::directory_iterator::~directory_iterator
                ((directory_iterator *)local_88);
      CLI::std::filesystem::__cxx11::directory_iterator::~directory_iterator
                ((directory_iterator *)local_68);
      CLI::std::filesystem::__cxx11::directory_iterator::~directory_iterator(&local_48);
      if (dir_entry._4_4_ == 2) {
        __range1._7_1_ = 1;
        dir_entry._4_4_ = 1;
      }
      if ((__range1._7_1_ & 1) == 0) {
        CLI::std::
        vector<std::filesystem::__cxx11::path,_std::allocator<std::filesystem::__cxx11::path>_>::
        ~vector(in_RDI);
      }
      return in_RDI;
    }
    local_a8 = (directory_entry *)
               std::filesystem::__cxx11::directory_iterator::operator*
                         ((directory_iterator *)local_68);
    if (app.type == 0) {
      ppVar3 = CLI::std::filesystem::__cxx11::directory_entry::path(local_a8);
      bVar1 = is_db_file(ppVar3);
      if (bVar1) {
        plVar2 = spdlog::default_logger_raw();
        spdlog::source_loc::source_loc
                  (&local_138,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/dkubek[P]NPRG041-image_match/apps/image_match.cpp"
                   ,0x102,"find_database_file");
        fmt::v7::basic_string_view<char>::basic_string_view(&local_148,"Found DB file {}");
        ppVar3 = CLI::std::filesystem::__cxx11::directory_entry::path(local_a8);
        CLI::std::filesystem::__cxx11::path::string(&local_168,ppVar3);
        loc_00.line = local_138.line;
        loc_00._12_4_ = local_138._12_4_;
        loc_00.filename = local_138.filename;
        loc_00.funcname = local_138.funcname;
        spdlog::logger::log<std::__cxx11::string>(plVar2,loc_00,debug,local_148,&local_168);
        std::__cxx11::string::~string((string *)&local_168);
        ppVar3 = CLI::std::filesystem::__cxx11::directory_entry::path(local_a8);
        CLI::std::
        vector<std::filesystem::__cxx11::path,_std::allocator<std::filesystem::__cxx11::path>_>::
        push_back(in_RDI,ppVar3);
      }
    }
    else {
      CLI::std::filesystem::__cxx11::directory_entry::path(local_a8);
      std::filesystem::absolute(&local_f8);
      std::filesystem::__cxx11::path::lexically_normal();
      database_filename_abi_cxx11_();
      bVar1 = CLI::std::filesystem::__cxx11::operator==(&local_d0,&local_120);
      CLI::std::filesystem::__cxx11::path::~path(&local_120);
      CLI::std::filesystem::__cxx11::path::~path(&local_d0);
      CLI::std::filesystem::__cxx11::path::~path((path *)&local_f8);
      if (bVar1) {
        ppVar3 = CLI::std::filesystem::__cxx11::directory_entry::path(local_a8);
        CLI::std::
        vector<std::filesystem::__cxx11::path,_std::allocator<std::filesystem::__cxx11::path>_>::
        push_back(in_RDI,ppVar3);
        __range1._7_1_ = 1;
        dir_entry._4_4_ = 1;
        goto LAB_001121e2;
      }
    }
    std::filesystem::__cxx11::directory_iterator::operator++((directory_iterator *)local_68);
  } while( true );
}

Assistant:

std::vector<path>
find_database_file()
{
    SPDLOG_DEBUG("Looking for database file...");

    std::vector<path> ans;
    for (auto&& dir_entry : directory_iterator(app.dataset)) {
        if (app.type) {
            if (absolute(dir_entry.path()).lexically_normal() ==
                database_filename()) {
                ans.push_back(dir_entry.path());
                return ans;
            }
            continue;
        }

        if (is_db_file(dir_entry.path())) {
            SPDLOG_DEBUG("Found DB file {}", dir_entry.path().string());
            ans.push_back(dir_entry.path());
        }
    }

    return ans;
}